

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

Gia_Man_t * Str_NtkToGia(Gia_Man_t *pGia,Str_Ntk_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  int *piVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  int iVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Str_Obj_t *pSVar11;
  Gia_Obj_t *pGVar12;
  Gia_Man_t *pGVar13;
  uint uVar14;
  Str_Obj_t *pSVar15;
  uint uVar16;
  
  if (pGia->pMuxes != (uint *)0x0) {
    __assert_fail("pGia->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                  ,0xaf,"Gia_Man_t *Str_NtkToGia(Gia_Man_t *, Str_Ntk_t *)");
  }
  p_00 = Gia_ManStart((pGia->nObjs * 3) / 2);
  pcVar4 = pGia->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar4);
  }
  p_00->pName = pcVar10;
  pcVar4 = pGia->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar4);
  }
  p_00->pSpec = pcVar10;
  Gia_ManHashStart(p_00);
  uVar16 = p->nObjs;
  if (0 < (int)uVar16) {
    pSVar11 = p->pObjs;
    pSVar15 = pSVar11;
    do {
      uVar14 = *(uint *)pSVar15;
      switch(uVar14 & 0xf) {
      case 1:
        iVar8 = 0;
        break;
      case 2:
        pGVar12 = Gia_ManAppendObj(p_00);
        uVar6 = *(ulong *)pGVar12;
        *(ulong *)pGVar12 = uVar6 | 0x9fffffff;
        *(ulong *)pGVar12 =
             uVar6 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar7 = p_00->pObjs;
        if ((pGVar12 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar12)) {
LAB_0076f3c5:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar7) >> 2) * -0x55555555);
        pGVar7 = p_00->pObjs;
        if ((pGVar12 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar12)) goto LAB_0076f3c5;
        iVar8 = (int)((ulong)((long)pGVar12 - (long)pGVar7) >> 2) * 0x55555556;
        break;
      case 3:
        pSVar15->iCopy = 1;
        if (0xf < uVar14) {
          uVar16 = 0;
          iVar8 = 1;
          do {
            uVar14 = pSVar15->iOffset + uVar16;
            if (((int)uVar14 < 0) || ((p->vFanins).nSize <= (int)uVar14)) goto LAB_0076f349;
            uVar14 = (p->vFanins).pArray[uVar14];
            if ((int)uVar14 < 0) goto LAB_0076f387;
            if (p->nObjs <= (int)(uVar14 >> 1)) goto LAB_0076f368;
            uVar1 = p->pObjs[uVar14 >> 1].iCopy;
            if ((int)uVar1 < 0) goto LAB_0076f3a6;
            iVar8 = Gia_ManHashAnd(p_00,iVar8,uVar1 ^ uVar14 & 1);
            pSVar15->iCopy = iVar8;
            uVar16 = uVar16 + 1;
          } while (uVar16 < *(uint *)pSVar15 >> 4);
        }
        goto LAB_0076f1ec;
      case 4:
        pSVar15->iCopy = 0;
        if (0xf < uVar14) {
          iVar8 = 0;
          uVar16 = 0;
          do {
            uVar14 = pSVar15->iOffset + uVar16;
            if (((int)uVar14 < 0) || ((p->vFanins).nSize <= (int)uVar14)) goto LAB_0076f349;
            uVar14 = (p->vFanins).pArray[uVar14];
            if ((int)uVar14 < 0) goto LAB_0076f387;
            if (p->nObjs <= (int)(uVar14 >> 1)) goto LAB_0076f368;
            uVar1 = p->pObjs[uVar14 >> 1].iCopy;
            if ((int)uVar1 < 0) goto LAB_0076f3a6;
            iVar8 = Gia_ManHashXor(p_00,iVar8,uVar1 ^ uVar14 & 1);
            pSVar15->iCopy = iVar8;
            uVar16 = uVar16 + 1;
          } while (uVar16 < *(uint *)pSVar15 >> 4);
        }
        goto LAB_0076f1ec;
      case 5:
        uVar14 = pSVar15->iOffset;
        if ((long)(int)uVar14 < -2) {
LAB_0076f349:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar1 = (p->vFanins).nSize;
        if ((int)uVar1 <= (int)(uVar14 + 2)) goto LAB_0076f349;
        piVar5 = (p->vFanins).pArray;
        uVar2 = piVar5[uVar14 + 2];
        if ((int)uVar2 < 0) {
LAB_0076f387:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        if ((int)uVar16 <= (int)(uVar2 >> 1)) {
LAB_0076f368:
          __assert_fail("i < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                        ,0x51,"Str_Obj_t *Str_NtkObj(Str_Ntk_t *, int)");
        }
        if (pSVar11[uVar2 >> 1].iCopy < 0) {
LAB_0076f3a6:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf5,"int Abc_LitNotCond(int, int)");
        }
        if (uVar1 <= uVar14 + 1) goto LAB_0076f349;
        uVar3 = piVar5[uVar14 + 1];
        if ((int)uVar3 < 0) goto LAB_0076f387;
        if (uVar16 <= uVar3 >> 1) goto LAB_0076f368;
        if (pSVar11[uVar3 >> 1].iCopy < 0) goto LAB_0076f3a6;
        if (((int)uVar14 < 0) || (uVar1 <= uVar14)) goto LAB_0076f349;
        uVar14 = piVar5[(int)uVar14];
        if ((int)uVar14 < 0) goto LAB_0076f387;
        if (uVar16 <= uVar14 >> 1) goto LAB_0076f368;
        if (pSVar11[uVar14 >> 1].iCopy < 0) goto LAB_0076f3a6;
        iVar8 = Gia_ManHashMux(p_00,pSVar11[uVar2 >> 1].iCopy ^ uVar2 & 1,
                               pSVar11[uVar3 >> 1].iCopy ^ uVar3 & 1,
                               pSVar11[uVar14 >> 1].iCopy ^ uVar14 & 1);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                      ,0xca,"Gia_Man_t *Str_NtkToGia(Gia_Man_t *, Str_Ntk_t *)");
      case 7:
        iVar8 = pSVar15->iOffset;
        if (((long)iVar8 < 0) || ((p->vFanins).nSize <= iVar8)) goto LAB_0076f349;
        uVar14 = (p->vFanins).pArray[iVar8];
        if ((int)uVar14 < 0) goto LAB_0076f387;
        if ((int)uVar16 <= (int)(uVar14 >> 1)) goto LAB_0076f368;
        if (pSVar11[uVar14 >> 1].iCopy < 0) goto LAB_0076f3a6;
        iVar8 = Gia_ManAppendCo(p_00,pSVar11[uVar14 >> 1].iCopy ^ uVar14 & 1);
      }
      pSVar15->iCopy = iVar8;
LAB_0076f1ec:
      pSVar15 = pSVar15 + 1;
      pSVar11 = p->pObjs;
      uVar16 = p->nObjs;
    } while ((int)((ulong)((long)pSVar15 - (long)pSVar11) >> 4) < (int)uVar16);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,pGia->nRegs);
  pGVar13 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar13;
}

Assistant:

Gia_Man_t * Str_NtkToGia( Gia_Man_t * pGia, Str_Ntk_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Str_Obj_t * pObj; int k;
    assert( pGia->pMuxes == NULL );
    pNew = Gia_ManStart( 3 * Gia_ManObjNum(pGia) / 2 );
    pNew->pName = Abc_UtilStrsav( pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    Gia_ManHashStart( pNew );
    Str_NtkManForEachObj( p, pObj )
    {
        if ( pObj->Type == STR_PI )
            pObj->iCopy = Gia_ManAppendCi( pNew );
        else if ( pObj->Type == STR_AND )
        {
            pObj->iCopy = 1;
            for ( k = 0; k < (int)pObj->nFanins; k++ )
                pObj->iCopy = Gia_ManHashAnd( pNew, pObj->iCopy, Str_ObjFaninCopy(p, pObj, k) );
        }
        else if ( pObj->Type == STR_XOR )
        {
            pObj->iCopy = 0;
            for ( k = 0; k < (int)pObj->nFanins; k++ )
                pObj->iCopy = Gia_ManHashXor( pNew, pObj->iCopy, Str_ObjFaninCopy(p, pObj, k) );
        }
        else if ( pObj->Type == STR_MUX )
            pObj->iCopy = Gia_ManHashMux( pNew, Str_ObjFaninCopy(p, pObj, 2), Str_ObjFaninCopy(p, pObj, 1), Str_ObjFaninCopy(p, pObj, 0) );
        else if ( pObj->Type == STR_PO )
            pObj->iCopy = Gia_ManAppendCo( pNew, Str_ObjFaninCopy(p, pObj, 0) );
        else if ( pObj->Type == STR_CONST0 )
            pObj->iCopy = 0;
        else assert( 0 );
    }
    Gia_ManHashStop( pNew );
//    assert( Gia_ManObjNum(pNew) <= Gia_ManObjNum(pGia) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(pGia) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}